

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathNewNodeSet(xmlNodePtr val)

{
  xmlNodeSetPtr pxVar1;
  xmlXPathObjectPtr ret;
  xmlNodePtr val_local;
  
  val_local = (xmlNodePtr)(*xmlMalloc)(0x48);
  if (val_local == (xmlNodePtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating nodeset\n");
    val_local = (xmlNodePtr)0x0;
  }
  else {
    memset(val_local,0,0x48);
    *(undefined4 *)&val_local->_private = 1;
    *(undefined4 *)&val_local->name = 0;
    pxVar1 = xmlXPathNodeSetCreate(val);
    *(xmlNodeSetPtr *)&val_local->type = pxVar1;
  }
  return (xmlXPathObjectPtr)val_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewNodeSet(xmlNodePtr val) {
    xmlXPathObjectPtr ret;

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating nodeset\n");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlXPathObject));
    ret->type = XPATH_NODESET;
    ret->boolval = 0;
    /* TODO: Check memory error. */
    ret->nodesetval = xmlXPathNodeSetCreate(val);
    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, XPATH_NODESET);
#endif
    return(ret);
}